

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

void __thiscall Parse::Object::setDimencionRequest(Object *this,string *anchor,string *size)

{
  bool bVar1;
  Size *pSVar2;
  
  if (this->dimencions == (Size *)0x0) {
    pSVar2 = (Size *)operator_new(0x40);
    (pSVar2->height)._M_dataplus._M_p = (pointer)0x0;
    (pSVar2->height)._M_string_length = 0;
    (pSVar2->height).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar2->height).field_2 + 8) = 0;
    (pSVar2->width).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar2->width).field_2 + 8) = 0;
    (pSVar2->width)._M_dataplus._M_p = (pointer)&(pSVar2->width).field_2;
    (pSVar2->width)._M_string_length = 0;
    (pSVar2->height)._M_dataplus._M_p = (pointer)&(pSVar2->height).field_2;
    (pSVar2->height).field_2._M_local_buf[0] = '\0';
    this->dimencions = pSVar2;
  }
  bVar1 = std::operator==(anchor,"width_request");
  if (bVar1) {
    std::__cxx11::string::assign((char *)this->dimencions);
  }
  bVar1 = std::operator==(anchor,"width_request");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&this->dimencions->height);
    return;
  }
  return;
}

Assistant:

void setDimencionRequest(std::string anchor, std::string size) {
                if (dimencions == NULL) {
                    dimencions = new Size();
                }
                if (anchor == "width_request") {
                    dimencions->width = (size.c_str());
                }
                if (anchor == "width_request") {
                    dimencions->height = (size.c_str());
                }
            }